

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::addStorage
          (Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Entry *__dest;
  long lVar9;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  char cVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar64;
  undefined1 auVar63 [16];
  int iVar65;
  char cVar66;
  char cVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  char cVar75;
  char cVar76;
  
  bVar13 = this->allocated;
  uVar11 = (ulong)bVar13;
  if (bVar13 == 0) {
    lVar12 = 0x30;
  }
  else if (bVar13 == 0x30) {
    lVar12 = 0x50;
  }
  else {
    lVar12 = uVar11 + 0x10;
  }
  __dest = (Entry *)operator_new__((ulong)((uint)lVar12 * 8));
  if (uVar11 != 0) {
    memcpy(__dest,this->entries,(ulong)((uint)bVar13 * 8));
  }
  if ((uint)bVar13 < (uint)lVar12) {
    cVar66 = bVar13 + 0xe;
    cVar74 = bVar13 + 0xf;
    cVar24 = bVar13 + 0xc;
    cVar25 = bVar13 + 0xd;
    cVar26 = bVar13 + 10;
    cVar27 = bVar13 + 0xb;
    cVar28 = bVar13 + 8;
    cVar29 = bVar13 + 9;
    cVar30 = bVar13 + 6;
    cVar31 = bVar13 + 7;
    cVar32 = bVar13 + 4;
    cVar33 = bVar13 + 5;
    cVar75 = bVar13 + 2;
    cVar76 = bVar13 + 3;
    cVar14 = bVar13 + 1;
    lVar9 = (lVar12 - uVar11) + -1;
    auVar15._8_4_ = (int)lVar9;
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    do {
      auVar63._8_4_ = (int)uVar10;
      auVar63._0_8_ = uVar10;
      auVar63._12_4_ = (int)(uVar10 >> 0x20);
      auVar36 = auVar15 ^ _DAT_0066f670;
      auVar34 = (auVar63 | _DAT_0066f660) ^ _DAT_0066f670;
      iVar64 = auVar36._0_4_;
      iVar40 = -(uint)(iVar64 < auVar34._0_4_);
      iVar65 = auVar36._4_4_;
      iVar51 = -(uint)(iVar65 < auVar34._4_4_);
      iVar38 = auVar36._8_4_;
      iVar52 = -(uint)(iVar38 < auVar34._8_4_);
      iVar39 = auVar36._12_4_;
      iVar53 = -(uint)(iVar39 < auVar34._12_4_);
      auVar67._4_4_ = iVar40;
      auVar67._0_4_ = iVar40;
      auVar67._8_4_ = iVar52;
      auVar67._12_4_ = iVar52;
      auVar59 = pshuflw(in_XMM12,auVar67,0xe8);
      auVar41._4_4_ = -(uint)(auVar34._4_4_ == iVar65);
      auVar41._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar41._0_4_ = auVar41._4_4_;
      auVar41._8_4_ = auVar41._12_4_;
      auVar54 = pshuflw(in_XMM10,auVar41,0xe8);
      auVar35._4_4_ = iVar51;
      auVar35._0_4_ = iVar51;
      auVar35._8_4_ = iVar53;
      auVar35._12_4_ = iVar53;
      auVar36 = pshuflw(_DAT_0066f670,auVar35,0xe8);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar36 | auVar54 & auVar59) ^ auVar34;
      auVar34 = packssdw(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        __dest[uVar11 + uVar10].storage.data[0] = bVar13 + 1;
      }
      auVar35 = auVar41 & auVar67 | auVar35;
      auVar34 = packssdw(auVar35,auVar35);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar36,auVar34 ^ auVar36);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 8 & 1) != 0) {
        __dest[uVar11 + uVar10 + 1].storage.data[0] = cVar14 + '\x01';
      }
      auVar34 = (auVar63 | _DAT_0066f650) ^ _DAT_0066f670;
      iVar40 = -(uint)(iVar64 < auVar34._0_4_);
      iVar52 = -(uint)(iVar65 < auVar34._4_4_);
      iVar51 = -(uint)(iVar38 < auVar34._8_4_);
      iVar53 = -(uint)(iVar39 < auVar34._12_4_);
      auVar59._4_4_ = iVar40;
      auVar59._0_4_ = iVar40;
      auVar59._8_4_ = iVar51;
      auVar59._12_4_ = iVar51;
      iVar40 = -(uint)(auVar34._4_4_ == iVar65);
      iVar51 = -(uint)(auVar34._12_4_ == iVar39);
      auVar68._4_4_ = iVar40;
      auVar68._0_4_ = iVar40;
      auVar68._8_4_ = iVar51;
      auVar68._12_4_ = iVar51;
      auVar60._4_4_ = iVar52;
      auVar60._0_4_ = iVar52;
      auVar60._8_4_ = iVar53;
      auVar60._12_4_ = iVar53;
      auVar34 = auVar68 & auVar59 | auVar60;
      auVar34 = packssdw(auVar34,auVar34);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar54,auVar34 ^ auVar54);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
        __dest[uVar11 + uVar10 + 2].storage.data[0] = cVar75 + '\x01';
      }
      auVar34 = pshufhw(auVar34,auVar59,0x84);
      auVar41 = pshufhw(auVar59,auVar68,0x84);
      auVar36 = pshufhw(auVar34,auVar60,0x84);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar16 = (auVar36 | auVar41 & auVar34) ^ auVar16;
      auVar34 = packssdw(auVar16,auVar16);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
        __dest[uVar11 + uVar10 + 3].storage.data[0] = cVar76 + '\x01';
      }
      auVar34 = (auVar63 | _DAT_0066f640) ^ _DAT_0066f670;
      auVar55._0_4_ = -(uint)(iVar64 < auVar34._0_4_);
      auVar55._4_4_ = -(uint)(iVar65 < auVar34._4_4_);
      auVar55._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar55._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar69._4_4_ = auVar55._0_4_;
      auVar69._0_4_ = auVar55._0_4_;
      auVar69._8_4_ = auVar55._8_4_;
      auVar69._12_4_ = auVar55._8_4_;
      auVar41 = pshuflw(auVar60,auVar69,0xe8);
      auVar17._0_4_ = -(uint)(auVar34._0_4_ == iVar64);
      auVar17._4_4_ = -(uint)(auVar34._4_4_ == iVar65);
      auVar17._8_4_ = -(uint)(auVar34._8_4_ == iVar38);
      auVar17._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar42._4_4_ = auVar17._4_4_;
      auVar42._0_4_ = auVar17._4_4_;
      auVar42._8_4_ = auVar17._12_4_;
      auVar42._12_4_ = auVar17._12_4_;
      auVar34 = pshuflw(auVar17,auVar42,0xe8);
      auVar43._4_4_ = auVar55._4_4_;
      auVar43._0_4_ = auVar55._4_4_;
      auVar43._8_4_ = auVar55._12_4_;
      auVar43._12_4_ = auVar55._12_4_;
      auVar36 = pshuflw(auVar55,auVar43,0xe8);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 & auVar41,(auVar36 | auVar34 & auVar41) ^ auVar1);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        __dest[uVar11 + uVar10 + 4].storage.data[0] = cVar32 + '\x01';
      }
      auVar43 = auVar42 & auVar69 | auVar43;
      auVar36 = packssdw(auVar43,auVar43);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34,auVar36 ^ auVar2);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._4_2_ >> 8 & 1) != 0) {
        __dest[uVar11 + uVar10 + 5].storage.data[0] = cVar33 + '\x01';
      }
      auVar34 = (auVar63 | _DAT_0066f630) ^ _DAT_0066f670;
      iVar40 = -(uint)(iVar64 < auVar34._0_4_);
      iVar52 = -(uint)(iVar65 < auVar34._4_4_);
      iVar51 = -(uint)(iVar38 < auVar34._8_4_);
      iVar53 = -(uint)(iVar39 < auVar34._12_4_);
      auVar44._4_4_ = iVar40;
      auVar44._0_4_ = iVar40;
      auVar44._8_4_ = iVar51;
      auVar44._12_4_ = iVar51;
      iVar40 = -(uint)(auVar34._4_4_ == iVar65);
      iVar51 = -(uint)(auVar34._12_4_ == iVar39);
      auVar61._4_4_ = iVar40;
      auVar61._0_4_ = iVar40;
      auVar61._8_4_ = iVar51;
      auVar61._12_4_ = iVar51;
      auVar70._4_4_ = iVar52;
      auVar70._0_4_ = iVar52;
      auVar70._8_4_ = iVar53;
      auVar70._12_4_ = iVar53;
      auVar34 = auVar61 & auVar44 | auVar70;
      auVar34 = packssdw(auVar34,auVar34);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar3,auVar34 ^ auVar3);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        __dest[uVar11 + uVar10 + 6].storage.data[0] = cVar30 + '\x01';
      }
      auVar34 = pshufhw(auVar34,auVar44,0x84);
      auVar41 = pshufhw(auVar44,auVar61,0x84);
      auVar36 = pshufhw(auVar34,auVar70,0x84);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = (auVar36 | auVar41 & auVar34) ^ auVar18;
      auVar34 = packssdw(auVar18,auVar18);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._6_2_ >> 8 & 1) != 0) {
        __dest[uVar11 + uVar10 + 7].storage.data[0] = cVar31 + '\x01';
      }
      auVar34 = (auVar63 | _DAT_0066f620) ^ _DAT_0066f670;
      auVar56._0_4_ = -(uint)(iVar64 < auVar34._0_4_);
      auVar56._4_4_ = -(uint)(iVar65 < auVar34._4_4_);
      auVar56._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar56._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar71._4_4_ = auVar56._0_4_;
      auVar71._0_4_ = auVar56._0_4_;
      auVar71._8_4_ = auVar56._8_4_;
      auVar71._12_4_ = auVar56._8_4_;
      auVar41 = pshuflw(auVar61,auVar71,0xe8);
      auVar19._0_4_ = -(uint)(auVar34._0_4_ == iVar64);
      auVar19._4_4_ = -(uint)(auVar34._4_4_ == iVar65);
      auVar19._8_4_ = -(uint)(auVar34._8_4_ == iVar38);
      auVar19._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar45._4_4_ = auVar19._4_4_;
      auVar45._0_4_ = auVar19._4_4_;
      auVar45._8_4_ = auVar19._12_4_;
      auVar45._12_4_ = auVar19._12_4_;
      auVar34 = pshuflw(auVar19,auVar45,0xe8);
      auVar46._4_4_ = auVar56._4_4_;
      auVar46._0_4_ = auVar56._4_4_;
      auVar46._8_4_ = auVar56._12_4_;
      auVar46._12_4_ = auVar56._12_4_;
      auVar36 = pshuflw(auVar56,auVar46,0xe8);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar57 = (auVar36 | auVar34 & auVar41) ^ auVar57;
      auVar36 = packssdw(auVar57,auVar57);
      auVar34 = packsswb(auVar34 & auVar41,auVar36);
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        __dest[uVar11 + uVar10 + 8].storage.data[0] = cVar28 + '\x01';
      }
      auVar46 = auVar45 & auVar71 | auVar46;
      auVar36 = packssdw(auVar46,auVar46);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar4,auVar36 ^ auVar4);
      auVar34 = packsswb(auVar34,auVar36);
      if ((auVar34._8_2_ >> 8 & 1) != 0) {
        __dest[uVar11 + uVar10 + 9].storage.data[0] = cVar29 + '\x01';
      }
      auVar34 = (auVar63 | _DAT_0066f610) ^ _DAT_0066f670;
      iVar40 = -(uint)(iVar64 < auVar34._0_4_);
      iVar52 = -(uint)(iVar65 < auVar34._4_4_);
      iVar51 = -(uint)(iVar38 < auVar34._8_4_);
      iVar53 = -(uint)(iVar39 < auVar34._12_4_);
      auVar47._4_4_ = iVar40;
      auVar47._0_4_ = iVar40;
      auVar47._8_4_ = iVar51;
      auVar47._12_4_ = iVar51;
      iVar40 = -(uint)(auVar34._4_4_ == iVar65);
      iVar51 = -(uint)(auVar34._12_4_ == iVar39);
      auVar62._4_4_ = iVar40;
      auVar62._0_4_ = iVar40;
      auVar62._8_4_ = iVar51;
      auVar62._12_4_ = iVar51;
      auVar72._4_4_ = iVar52;
      auVar72._0_4_ = iVar52;
      auVar72._8_4_ = iVar53;
      auVar72._12_4_ = iVar53;
      auVar34 = auVar62 & auVar47 | auVar72;
      auVar34 = packssdw(auVar34,auVar34);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        __dest[uVar11 + uVar10 + 10].storage.data[0] = cVar26 + '\x01';
      }
      auVar34 = pshufhw(auVar34,auVar47,0x84);
      auVar41 = pshufhw(auVar47,auVar62,0x84);
      auVar36 = pshufhw(auVar34,auVar72,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar36 | auVar41 & auVar34) ^ auVar20;
      auVar34 = packssdw(auVar20,auVar20);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._10_2_ >> 8 & 1) != 0) {
        __dest[uVar11 + uVar10 + 0xb].storage.data[0] = cVar27 + '\x01';
      }
      auVar34 = (auVar63 | _DAT_0066f600) ^ _DAT_0066f670;
      auVar58._0_4_ = -(uint)(iVar64 < auVar34._0_4_);
      auVar58._4_4_ = -(uint)(iVar65 < auVar34._4_4_);
      auVar58._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar58._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar73._4_4_ = auVar58._0_4_;
      auVar73._0_4_ = auVar58._0_4_;
      auVar73._8_4_ = auVar58._8_4_;
      auVar73._12_4_ = auVar58._8_4_;
      auVar41 = pshuflw(auVar62,auVar73,0xe8);
      auVar21._0_4_ = -(uint)(auVar34._0_4_ == iVar64);
      auVar21._4_4_ = -(uint)(auVar34._4_4_ == iVar65);
      auVar21._8_4_ = -(uint)(auVar34._8_4_ == iVar38);
      auVar21._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar48._4_4_ = auVar21._4_4_;
      auVar48._0_4_ = auVar21._4_4_;
      auVar48._8_4_ = auVar21._12_4_;
      auVar48._12_4_ = auVar21._12_4_;
      auVar34 = pshuflw(auVar21,auVar48,0xe8);
      auVar49._4_4_ = auVar58._4_4_;
      auVar49._0_4_ = auVar58._4_4_;
      auVar49._8_4_ = auVar58._12_4_;
      auVar49._12_4_ = auVar58._12_4_;
      auVar36 = pshuflw(auVar58,auVar49,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 & auVar41,(auVar36 | auVar34 & auVar41) ^ auVar6);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        __dest[uVar11 + uVar10 + 0xc].storage.data[0] = cVar24 + '\x01';
      }
      auVar49 = auVar48 & auVar73 | auVar49;
      auVar36 = packssdw(auVar49,auVar49);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34,auVar36 ^ auVar7);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._12_2_ >> 8 & 1) != 0) {
        __dest[uVar11 + uVar10 + 0xd].storage.data[0] = cVar25 + '\x01';
      }
      auVar34 = (auVar63 | _DAT_0066f5f0) ^ _DAT_0066f670;
      auVar22._0_4_ = -(uint)(iVar64 < auVar34._0_4_);
      auVar22._4_4_ = -(uint)(iVar65 < auVar34._4_4_);
      auVar22._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar22._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar50._4_4_ = auVar22._0_4_;
      auVar50._0_4_ = auVar22._0_4_;
      auVar50._8_4_ = auVar22._8_4_;
      auVar50._12_4_ = auVar22._8_4_;
      iVar64 = -(uint)(auVar34._4_4_ == iVar65);
      iVar65 = -(uint)(auVar34._12_4_ == iVar39);
      auVar37._4_4_ = iVar64;
      auVar37._0_4_ = iVar64;
      auVar37._8_4_ = iVar65;
      auVar37._12_4_ = iVar65;
      in_XMM12._4_4_ = auVar22._4_4_;
      in_XMM12._0_4_ = auVar22._4_4_;
      in_XMM12._8_4_ = auVar22._12_4_;
      in_XMM12._12_4_ = auVar22._12_4_;
      in_XMM10 = auVar37 & auVar50 | in_XMM12;
      auVar34 = packssdw(auVar22,in_XMM10);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        __dest[uVar11 + uVar10 + 0xe].storage.data[0] = cVar66 + '\x01';
      }
      auVar34 = pshufhw(auVar34,auVar50,0x84);
      auVar41 = pshufhw(auVar37,auVar37,0x84);
      auVar36 = pshufhw(auVar34,in_XMM12,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar36 | auVar41 & auVar34) ^ auVar23;
      auVar34 = packssdw(auVar23,auVar23);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._14_2_ >> 8 & 1) != 0) {
        __dest[uVar11 + uVar10 + 0xf].storage.data[0] = cVar74 + '\x01';
      }
      uVar10 = uVar10 + 0x10;
      bVar13 = bVar13 + 0x10;
      cVar14 = cVar14 + '\x10';
      cVar75 = cVar75 + '\x10';
      cVar76 = cVar76 + '\x10';
      cVar32 = cVar32 + '\x10';
      cVar33 = cVar33 + '\x10';
      cVar30 = cVar30 + '\x10';
      cVar31 = cVar31 + '\x10';
      cVar28 = cVar28 + '\x10';
      cVar29 = cVar29 + '\x10';
      cVar26 = cVar26 + '\x10';
      cVar27 = cVar27 + '\x10';
      cVar24 = cVar24 + '\x10';
      cVar25 = cVar25 + '\x10';
      cVar66 = cVar66 + '\x10';
      cVar74 = cVar74 + '\x10';
    } while (((lVar12 - uVar11) + 0xf & 0xfffffffffffffff0) != uVar10);
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = __dest;
  this->allocated = (uchar)lVar12;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }